

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

xmlCharEncError UTF16LEToUTF8(void *vctxt,uchar *out,int *outlen,uchar *in,int *inlen,int flush)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  xmlCharEncError xVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  xmlCharEncError xVar10;
  ushort *puVar11;
  byte *pbVar12;
  long lVar13;
  
  iVar9 = (int)out;
  iVar6 = (int)in;
  puVar11 = (ushort *)(in + ((long)*inlen & 0xfffffffffffffffe));
  pbVar12 = out + *outlen;
  xVar5 = XML_ENC_ERR_SPACE;
  do {
    if (puVar11 <= in) {
LAB_0012a743:
      xVar10 = (int)out - iVar9;
      xVar5 = xVar10;
LAB_0012a753:
      *outlen = xVar10;
      *inlen = (int)in - iVar6;
      return xVar5;
    }
    bVar1 = (byte)*(ushort *)in;
    bVar2 = *(byte *)((long)in + 1);
    uVar3 = *(ushort *)in;
    if (0x7f < uVar3) {
      if (bVar2 < 8) {
        if (1 < (long)pbVar12 - (long)out) {
          *out = (byte)(uVar3 >> 6) | 0xc0;
          out[1] = bVar1 & 0x3f | 0x80;
          lVar7 = 2;
          lVar13 = 2;
          goto LAB_0012a738;
        }
      }
      else if ((bVar2 & 0xf8) == 0xd8) {
        if ((bVar2 & 0xdc) == 0xd8) {
          if ((long)puVar11 - (long)in < 4) goto LAB_0012a743;
          if ((*(byte *)((long)in + 3) & 0xfc) == 0xdc) {
            if ((long)pbVar12 - (long)out < 4) goto LAB_0012a750;
            uVar4 = *(ushort *)((long)in + 2);
            uVar8 = (uint)uVar3 * 0x400 + (uint)CONCAT11(*(byte *)((long)in + 3),(byte)uVar4) +
                    0xfca02400;
            *out = (byte)(uVar8 >> 0x12) | 0xf0;
            out[1] = (byte)(uVar8 >> 0xc) & 0x3f | 0x80;
            out[2] = (byte)(uVar8 >> 6) & 0x3f | 0x80;
            out[3] = (byte)uVar4 & 0x3f | 0x80;
            lVar13 = 4;
            lVar7 = 4;
            goto LAB_0012a738;
          }
        }
        xVar5 = XML_ENC_ERR_INPUT;
      }
      else if (2 < (long)pbVar12 - (long)out) {
        *out = bVar2 >> 4 | 0xe0;
        out[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
        out[2] = bVar1 & 0x3f | 0x80;
        lVar7 = 2;
        lVar13 = 3;
        goto LAB_0012a738;
      }
LAB_0012a750:
      xVar10 = (int)out - iVar9;
      goto LAB_0012a753;
    }
    if (pbVar12 <= out) goto LAB_0012a750;
    *out = bVar1;
    lVar7 = 2;
    lVar13 = 1;
LAB_0012a738:
    in = (uchar *)((long)in + lVar7);
    out = out + lVar13;
  } while( true );
}

Assistant:

static xmlCharEncError
UTF16LEToUTF8(void *vctxt ATTRIBUTE_UNUSED,
              unsigned char *out, int *outlen,
              const unsigned char *in, int *inlen,
              int flush ATTRIBUTE_UNUSED) {
    const unsigned char *instart = in;
    const unsigned char *inend = in + (*inlen & ~1);
    unsigned char *outstart = out;
    unsigned char *outend = out + *outlen;
    unsigned c, d;
    int ret = XML_ENC_ERR_SPACE;

    while (in < inend) {
        c = in[0] | (in[1] << 8);

        if (c < 0x80) {
            if (out >= outend)
                goto done;
            out[0] = c;
            in += 2;
            out += 1;
        } else if (c < 0x800) {
            if (outend - out < 2)
                goto done;
            out[0] = (c >> 6)   | 0xC0;
            out[1] = (c & 0x3F) | 0x80;
            in += 2;
            out += 2;
        } else if ((c & 0xF800) != 0xD800) {
            if (outend - out < 3)
                goto done;
            out[0] =  (c >> 12)         | 0xE0;
            out[1] = ((c >>  6) & 0x3F) | 0x80;
            out[2] =  (c        & 0x3F) | 0x80;
            in += 2;
            out += 3;
        } else {
            /* Surrogate pair */
            if ((c & 0xFC00) != 0xD800) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }
	    if (inend - in < 4)
		break;
            d = in[2] | (in[3] << 8);
            if ((d & 0xFC00) != 0xDC00) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }
	    if (outend - out < 4)
		goto done;
            c = (c << 10) + d - ((0xD800 << 10) + 0xDC00 - 0x10000);
            out[0] =  (c >> 18)         | 0xF0;
            out[1] = ((c >> 12) & 0x3F) | 0x80;
            out[2] = ((c >>  6) & 0x3F) | 0x80;
            out[3] =  (c        & 0x3F) | 0x80;
            in += 4;
            out += 4;
        }
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}